

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

BrushData parseBrushValue(Value *v,QPalette *pal)

{
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView latin1_03;
  QLatin1StringView latin1_04;
  QLatin1StringView latin1_05;
  QLatin1StringView latin1_06;
  QLatin1StringView latin1_07;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  qsizetype qVar5;
  double *pdVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar7;
  int *in_RSI;
  QBrush in_RDI;
  long in_FS_OFFSET;
  QRadialGradient *this;
  QGradient *this_00;
  double dVar8;
  double cx;
  QBrush *this_01;
  QLatin1StringView QVar9;
  QLatin1StringView QVar10;
  BrushData BVar11;
  bool dependsOnThePalette;
  int coordinateMode;
  int spread;
  int gradType;
  BrushData *bd;
  QConicalGradient cg;
  QRadialGradient rg;
  QLinearGradient lg;
  QString attr;
  Parser parser;
  QStringList coordinateModes;
  QStringList spreads;
  QList<std::pair<double,_QColor>_> stops;
  QHash<QString,_double> vars;
  QStringList gradFuncs;
  QStringList lst;
  ColorData cd;
  ColorData c;
  Value value;
  Value color;
  Value stop;
  undefined4 in_stack_fffffffffffff8c8;
  ColorRole in_stack_fffffffffffff8cc;
  undefined4 in_stack_fffffffffffff8d0;
  CaseSensitivity in_stack_fffffffffffff8d4;
  Parser *in_stack_fffffffffffff8d8;
  Parser *in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8ec;
  QGradient *in_stack_fffffffffffff8f0;
  QLinearGradient *in_stack_fffffffffffff8f8;
  qsizetype in_stack_fffffffffffff900;
  Value *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  Value *in_stack_fffffffffffff9d0;
  CaseSensitivity local_5ec;
  Spread local_5b8;
  QGradient local_518;
  QLatin1StringView local_4b8;
  QLatin1StringView local_4a8;
  QLatin1StringView local_498;
  QLatin1StringView local_488;
  QLatin1StringView local_478;
  QGradient local_468;
  QLatin1StringView local_408;
  QLatin1StringView local_3f8;
  QLatin1StringView local_3e8;
  QLatin1StringView local_3d8;
  QGradient local_3c8;
  QColor local_340;
  double local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  undefined1 local_310 [160];
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  QHash<QString,_double> local_1e0 [16];
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  QList<QString> local_148;
  QColor local_128;
  pair<double,_QColor> local_118;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined8 local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  bool abStack_c8 [72];
  undefined1 local_80 [40];
  undefined1 local_58 [8];
  bool local_50 [72];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  local_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = &DAT_aaaaaaaaaaaaaaaa;
  QCss::Value::Value((Value *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                     (Value *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
  parseColorValue(in_stack_fffffffffffff9d0);
  QCss::Value::~Value((Value *)0xa30957);
  if (local_d8._4_4_ == 1) {
    QBrush::QBrush((QBrush *)in_stack_fffffffffffff8e0,(QColor *)in_stack_fffffffffffff8d8,
                   in_stack_fffffffffffff8d4);
    QCss::BrushData::BrushData
              ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               (QBrush *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
    QBrush::~QBrush((QBrush *)0xa3099d);
    uVar7 = extraout_RDX;
  }
  else if (local_d8._4_4_ == 2) {
    QCss::BrushData::BrushData
              ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
               in_stack_fffffffffffff8cc);
    uVar7 = extraout_RDX_00;
  }
  else if (*in_RSI == 9) {
    local_148.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_148.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QVariant::toStringList();
    qVar5 = QList<QString>::size(&local_148);
    if (qVar5 == 2) {
      local_160 = &DAT_aaaaaaaaaaaaaaaa;
      local_158 = &DAT_aaaaaaaaaaaaaaaa;
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      QList<QString>::QList((QList<QString> *)0xa30a96);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff8d8,
                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      QVar9.m_data = (char *)in_stack_fffffffffffff908;
      QVar9.m_size = in_stack_fffffffffffff900;
      QString::QString((QString *)in_stack_fffffffffffff8e0,QVar9);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff8d8,
                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      QVar10.m_data = (char *)in_stack_fffffffffffff908;
      QVar10.m_size = in_stack_fffffffffffff900;
      QString::QString((QString *)in_stack_fffffffffffff8e0,QVar10);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff8d8,
                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      latin1.m_data = (char *)in_stack_fffffffffffff908;
      latin1.m_size = in_stack_fffffffffffff900;
      QString::QString((QString *)in_stack_fffffffffffff8e0,latin1);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffff8d8,
                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      latin1_00.m_data = (char *)in_stack_fffffffffffff908;
      latin1_00.m_size = in_stack_fffffffffffff900;
      QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_00);
      QList<QString>::operator<<
                ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                 (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      QString::~QString((QString *)0xa30c07);
      QString::~QString((QString *)0xa30c14);
      QString::~QString((QString *)0xa30c21);
      QString::~QString((QString *)0xa30c2e);
      QList<QString>::at((QList<QString> *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      QString::toLower((QString *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
      qVar5 = QListSpecialMethods<QString>::indexOf
                        ((QListSpecialMethods<QString> *)
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         (QString *)in_stack_fffffffffffff8e0,(qsizetype)in_stack_fffffffffffff8d8,
                         in_stack_fffffffffffff8d4);
      iVar3 = (int)qVar5;
      QString::~QString((QString *)0xa30c93);
      if (iVar3 == -1) {
        QCss::BrushData::BrushData
                  ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      }
      else {
        local_1e0[0].d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QHash<QString,_double>::QHash(local_1e0);
        local_1f8 = &DAT_aaaaaaaaaaaaaaaa;
        local_1f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_1e8 = &DAT_aaaaaaaaaaaaaaaa;
        QList<std::pair<double,_QColor>_>::QList((QList<std::pair<double,_QColor>_> *)0xa30d12);
        local_5b8 = ~PadSpread;
        local_210 = &DAT_aaaaaaaaaaaaaaaa;
        local_208 = &DAT_aaaaaaaaaaaaaaaa;
        local_200 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::QList((QList<QString> *)0xa30d57);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_01.m_data = (char *)in_stack_fffffffffffff908;
        latin1_01.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_01);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_02.m_data = (char *)in_stack_fffffffffffff908;
        latin1_02.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_02);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_03.m_data = (char *)in_stack_fffffffffffff908;
        latin1_03.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_03);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        QString::~QString((QString *)0xa30e61);
        QString::~QString((QString *)0xa30e6e);
        QString::~QString((QString *)0xa30e7b);
        local_5ec = ~CaseInsensitive;
        local_270 = &DAT_aaaaaaaaaaaaaaaa;
        local_268 = &DAT_aaaaaaaaaaaaaaaa;
        local_260 = &DAT_aaaaaaaaaaaaaaaa;
        QList<QString>::QList((QList<QString> *)0xa30ec0);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_04.m_data = (char *)in_stack_fffffffffffff908;
        latin1_04.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_04);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_05.m_data = (char *)in_stack_fffffffffffff908;
        latin1_05.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_05);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffff8d8,
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_06.m_data = (char *)in_stack_fffffffffffff908;
        latin1_06.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_06);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        QVar9 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)in_stack_fffffffffffff8d8,
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        latin1_07.m_data = (char *)in_stack_fffffffffffff908;
        latin1_07.m_size = in_stack_fffffffffffff900;
        QString::QString((QString *)in_stack_fffffffffffff8e0,latin1_07);
        QList<QString>::operator<<
                  ((QList<QString> *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        QString::~QString((QString *)0xa31031);
        QString::~QString((QString *)0xa3103e);
        QString::~QString((QString *)0xa3104b);
        QString::~QString((QString *)0xa31058);
        bVar1 = false;
        memset(local_310,0xaa,0x40);
        QList<QString>::at((QList<QString> *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                           CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
        QCss::Parser::Parser
                  (in_stack_fffffffffffff8e0,(QString *)in_stack_fffffffffffff8d8,
                   SUB41(in_stack_fffffffffffff8d4 >> 0x18,0));
        do {
          bVar2 = QCss::Parser::hasNext
                            ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0)
                            );
          if (!bVar2) {
            if (iVar3 == 0) {
              memcpy(&local_3c8,&DAT_00bef860,0x58);
              local_3d8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_3e8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_3f8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_408 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QLinearGradient::QLinearGradient
                        (in_stack_fffffffffffff8f8,(qreal)in_stack_fffffffffffff8f0,
                         (qreal)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         (qreal)in_stack_fffffffffffff8e0,(qreal)in_stack_fffffffffffff8d8);
              if ((int)local_5ec < 0) {
                local_5ec = 2;
              }
              QGradient::setCoordinateMode(&local_3c8,local_5ec);
              QGradient::setStops(in_stack_fffffffffffff8f0,
                                  (QGradientStops *)
                                  CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
              if (local_5b8 != ~PadSpread) {
                QGradient::setSpread(&local_3c8,local_5b8);
              }
              *(undefined1 **)
               in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = &DAT_aaaaaaaaaaaaaaaa;
              *(undefined1 **)
               ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                      .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8) =
                   &DAT_aaaaaaaaaaaaaaaa;
              QBrush::QBrush((QBrush *)in_stack_fffffffffffff8d8,
                             (QGradient *)
                             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QCss::BrushData::BrushData
                        ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (QBrush *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              QBrush::~QBrush((QBrush *)0xa317ea);
              if (bVar1) {
                *(undefined4 *)
                 ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                        _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 0xc) = 3;
              }
              QLinearGradient::~QLinearGradient((QLinearGradient *)0xa3183a);
            }
            else if (iVar3 == 1) {
              memcpy(&local_468,&DAT_00bef8b8,0x58);
              local_478 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              this = (QRadialGradient *)
                     QHash<QString,_double>::value<QLatin1String,_true>
                               ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                                (QLatin1String *)
                                CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_488 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              this_00 = (QGradient *)
                        QHash<QString,_double>::value<QLatin1String,_true>
                                  ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                                   (QLatin1String *)
                                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_498 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              dVar8 = QHash<QString,_double>::value<QLatin1String,_true>
                                ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                                 (QLatin1String *)
                                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_4a8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              cx = QHash<QString,_double>::value<QLatin1String,_true>
                             ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                              (QLatin1String *)
                              CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              local_4b8 = Qt::Literals::StringLiterals::operator____L1
                                    ((char *)in_stack_fffffffffffff8d8,
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QRadialGradient::QRadialGradient
                        (this,cx,dVar8,(qreal)this_00,
                         (qreal)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                         (qreal)in_stack_fffffffffffff8e0);
              if ((int)local_5ec < 0) {
                local_5ec = 2;
              }
              QGradient::setCoordinateMode(&local_468,local_5ec);
              QGradient::setStops(this_00,(QGradientStops *)
                                          CONCAT44(local_5ec,in_stack_fffffffffffff8e8));
              if (local_5b8 != ~PadSpread) {
                QGradient::setSpread(&local_468,local_5b8);
              }
              *(undefined1 **)
               in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = &DAT_aaaaaaaaaaaaaaaa;
              *(undefined1 **)
               ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                      .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8) =
                   &DAT_aaaaaaaaaaaaaaaa;
              QBrush::QBrush((QBrush *)in_stack_fffffffffffff8d8,
                             (QGradient *)
                             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QCss::BrushData::BrushData
                        ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (QBrush *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              QBrush::~QBrush((QBrush *)0xa31a74);
              if (bVar1) {
                *(undefined4 *)
                 ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                        _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 0xc) = 3;
              }
              QRadialGradient::~QRadialGradient((QRadialGradient *)0xa31ac4);
            }
            else if (iVar3 == 2) {
              memcpy(&local_518,&DAT_00bef910,0x58);
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff8d8,
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              dVar8 = QHash<QString,_double>::value<QLatin1String,_true>
                                ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                                 (QLatin1String *)
                                 CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)in_stack_fffffffffffff8d8,
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              this_01 = (QBrush *)
                        QHash<QString,_double>::value<QLatin1String,_true>
                                  ((QHash<QString,_double> *)in_stack_fffffffffffff8d8,
                                   (QLatin1String *)
                                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)this_01,
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QHash<QString,_double>::value<QLatin1String,_true>
                        ((QHash<QString,_double> *)this_01,
                         (QLatin1String *)
                         CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QConicalGradient::QConicalGradient
                        ((QConicalGradient *)
                         CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),dVar8,
                         (qreal)this_01,
                         (qreal)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              in_stack_fffffffffffff8d4 = local_5ec;
              if ((int)local_5ec < 0) {
                in_stack_fffffffffffff8d4 = 2;
              }
              QGradient::setCoordinateMode(&local_518,in_stack_fffffffffffff8d4);
              QGradient::setStops(in_stack_fffffffffffff8f0,
                                  (QGradientStops *)
                                  CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
              if (local_5b8 != ~PadSpread) {
                QGradient::setSpread(&local_518,local_5b8);
              }
              *(undefined1 **)
               in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
               super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
               super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = &DAT_aaaaaaaaaaaaaaaa;
              *(undefined1 **)
               ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t
                      .super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 8) =
                   &DAT_aaaaaaaaaaaaaaaa;
              QBrush::QBrush(this_01,(QGradient *)
                                     CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              QCss::BrushData::BrushData
                        ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                         (QBrush *)CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
              QBrush::~QBrush((QBrush *)0xa31c7a);
              if (bVar1) {
                *(undefined4 *)
                 ((long)in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                        _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                        super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 0xc) = 3;
              }
              QConicalGradient::~QConicalGradient((QConicalGradient *)0xa31cca);
            }
            else {
              QCss::BrushData::BrushData
                        ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0))
              ;
            }
            break;
          }
          QCss::Parser::skipSpace
                    ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          bVar2 = QCss::Parser::test(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
          if (!bVar2) {
            QCss::BrushData::BrushData
                      ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            break;
          }
          local_328 = &DAT_aaaaaaaaaaaaaaaa;
          local_320 = &DAT_aaaaaaaaaaaaaaaa;
          local_318 = &DAT_aaaaaaaaaaaaaaaa;
          QCss::Parser::lexem(in_stack_fffffffffffff8d8);
          QCss::Parser::skipSpace
                    ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
          bVar2 = QCss::Parser::test(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
          if (bVar2) {
            QCss::Parser::skipSpace
                      ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            QVar10 = Qt::Literals::StringLiterals::operator____L1
                               ((char *)in_stack_fffffffffffff8d8,
                                CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            iVar4 = QString::compare((QLatin1String *)&local_328,(CaseSensitivity)QVar10.m_size);
            if (iVar4 == 0) {
              memset(local_58,0xaa,0x28);
              QCss::Value::Value((Value *)0xa311ed);
              memset(local_80,0xaa,0x28);
              QCss::Value::Value((Value *)0xa31211);
              QCss::Parser::next((Parser *)0xa3121e);
              bVar2 = QCss::Parser::parseTerm
                                ((Parser *)
                                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                                 in_stack_fffffffffffff908);
              if (bVar2) {
                QCss::Parser::skipSpace
                          ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                QCss::Parser::next((Parser *)0xa3126e);
                bVar2 = QCss::Parser::parseTerm
                                  ((Parser *)
                                   CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                                   in_stack_fffffffffffff908);
                if (bVar2) {
                  local_100 = &DAT_aaaaaaaaaaaaaaaa;
                  local_f8 = &DAT_aaaaaaaaaaaaaaaa;
                  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
                  QCss::Value::Value((Value *)CONCAT44(in_stack_fffffffffffff8d4,
                                                       in_stack_fffffffffffff8d0),
                                     (Value *)CONCAT44(in_stack_fffffffffffff8cc,
                                                       in_stack_fffffffffffff8c8));
                  parseColorValue((Value *)QVar9.m_size);
                  QCss::Value::~Value((Value *)0xa31308);
                  if (local_f0._4_4_ == 2) {
                    bVar1 = true;
                  }
                  local_330 = (double)QVariant::toReal(local_50);
                  local_340 = colorFromData((ColorData *)in_stack_fffffffffffff8d8,
                                            (QPalette *)
                                            CONCAT44(in_stack_fffffffffffff8d4,
                                                     in_stack_fffffffffffff8d0));
                  local_128._0_8_ = local_340._0_8_;
                  local_128.ct._4_4_ = local_340.ct._4_4_;
                  local_128.ct.argb.pad = local_340.ct._8_2_;
                  std::pair<double,_QColor>::pair<double,_QColor,_true>
                            (&local_118,&local_330,&local_128);
                  QList<std::pair<double,_QColor>_>::append
                            ((QList<std::pair<double,_QColor>_> *)
                             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0),
                             (rvalue_ref)
                             CONCAT44(in_stack_fffffffffffff8cc,in_stack_fffffffffffff8c8));
                  bVar2 = false;
                }
                else {
                  QCss::BrushData::BrushData
                            ((BrushData *)
                             CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                  bVar2 = true;
                }
              }
              else {
                QCss::BrushData::BrushData
                          ((BrushData *)
                           CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                bVar2 = true;
              }
              QCss::Value::~Value((Value *)0xa313d1);
              QCss::Value::~Value((Value *)0xa313de);
              if (bVar2) goto LAB_00a315d4;
            }
            else {
              QCss::Parser::next((Parser *)0xa31401);
              memset(local_d0,0xaa,0x28);
              QCss::Value::Value((Value *)0xa31425);
              QCss::Parser::parseTerm
                        ((Parser *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                         in_stack_fffffffffffff908);
              QVar10 = Qt::Literals::StringLiterals::operator____L1
                                 ((char *)in_stack_fffffffffffff8d8,
                                  CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
              iVar4 = QString::compare((QLatin1String *)&local_328,(CaseSensitivity)QVar10.m_size);
              if (iVar4 == 0) {
                QVariant::toString();
                qVar5 = QListSpecialMethods<QString>::indexOf
                                  ((QListSpecialMethods<QString> *)
                                   CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                                   (QString *)in_stack_fffffffffffff8e0,
                                   (qsizetype)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
                local_5b8 = (Spread)qVar5;
                QString::~QString((QString *)0xa314ca);
              }
              else {
                QVar10 = Qt::Literals::StringLiterals::operator____L1
                                   ((char *)in_stack_fffffffffffff8d8,
                                    CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
                iVar4 = QString::compare((QLatin1String *)&local_328,(CaseSensitivity)QVar10.m_size)
                ;
                if (iVar4 == 0) {
                  QVariant::toString();
                  qVar5 = QListSpecialMethods<QString>::indexOf
                                    ((QListSpecialMethods<QString> *)
                                     CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8),
                                     (QString *)in_stack_fffffffffffff8e0,
                                     (qsizetype)in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4)
                  ;
                  local_5ec = (CaseSensitivity)qVar5;
                  QString::~QString((QString *)0xa3155f);
                }
                else {
                  dVar8 = (double)QVariant::toReal(abStack_c8);
                  pdVar6 = QHash<QString,_double>::operator[]
                                     ((QHash<QString,_double> *)in_stack_fffffffffffff8e0,
                                      (QString *)in_stack_fffffffffffff8d8);
                  *pdVar6 = dVar8;
                }
              }
              QCss::Value::~Value((Value *)0xa315aa);
            }
            QCss::Parser::skipSpace
                      ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            QCss::Parser::test(in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d4);
            bVar2 = false;
          }
          else {
            QCss::BrushData::BrushData
                      ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
            bVar2 = true;
          }
LAB_00a315d4:
          QString::~QString((QString *)0xa315e1);
        } while (!bVar2);
        QCss::Parser::~Parser
                  ((Parser *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
        QList<QString>::~QList((QList<QString> *)0xa31cfe);
        QList<QString>::~QList((QList<QString> *)0xa31d0b);
        QList<std::pair<double,_QColor>_>::~QList((QList<std::pair<double,_QColor>_> *)0xa31d18);
        QHash<QString,_double>::~QHash
                  ((QHash<QString,_double> *)
                   CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
      }
      QList<QString>::~QList((QList<QString> *)0xa31d32);
    }
    else {
      QCss::BrushData::BrushData
                ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    }
    QList<QString>::~QList((QList<QString> *)0xa31d3f);
    uVar7 = extraout_RDX_02;
  }
  else {
    QCss::BrushData::BrushData
              ((BrushData *)CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
    uVar7 = extraout_RDX_01;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  BVar11.role = (int)uVar7;
  BVar11.type = (int)((ulong)uVar7 >> 0x20);
  BVar11.brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
       in_RDI.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl;
  return BVar11;
}

Assistant:

static BrushData parseBrushValue(const QCss::Value &v, const QPalette &pal)
{
    ColorData c = parseColorValue(v);
    if (c.type == ColorData::Color) {
        return QBrush(c.color);
    } else if (c.type == ColorData::Role) {
        return c.role;
    }

    if (v.type != Value::Function)
        return BrushData();

    QStringList lst = v.variant.toStringList();
    if (lst.size() != 2)
        return BrushData();

    QStringList gradFuncs;
    gradFuncs << "qlineargradient"_L1 << "qradialgradient"_L1 << "qconicalgradient"_L1 << "qgradient"_L1;
    int gradType = -1;

    if ((gradType = gradFuncs.indexOf(lst.at(0).toLower())) == -1)
        return BrushData();

    QHash<QString, qreal> vars;
    QList<QGradientStop> stops;

    int spread = -1;
    QStringList spreads;
    spreads << "pad"_L1 << "reflect"_L1 << "repeat"_L1;

    int coordinateMode = -1;
    QStringList coordinateModes;
    coordinateModes << "logical"_L1 << "stretchtodevice"_L1 << "objectbounding"_L1 << "object"_L1;

    bool dependsOnThePalette = false;
    Parser parser(lst.at(1));
    while (parser.hasNext()) {
        parser.skipSpace();
        if (!parser.test(IDENT))
            return BrushData();
        QString attr = parser.lexem();
        parser.skipSpace();
        if (!parser.test(COLON))
            return BrushData();
        parser.skipSpace();
        if (attr.compare("stop"_L1, Qt::CaseInsensitive) == 0) {
            QCss::Value stop, color;
            parser.next();
            if (!parser.parseTerm(&stop)) return BrushData();
            parser.skipSpace();
            parser.next();
            if (!parser.parseTerm(&color)) return BrushData();
            ColorData cd = parseColorValue(color);
            if (cd.type == ColorData::Role)
                dependsOnThePalette = true;
            stops.append(QGradientStop(stop.variant.toReal(), colorFromData(cd, pal)));
        } else {
            parser.next();
            QCss::Value value;
            (void)parser.parseTerm(&value);
            if (attr.compare("spread"_L1, Qt::CaseInsensitive) == 0)
                spread = spreads.indexOf(value.variant.toString());
            else if (attr.compare("coordinatemode"_L1, Qt::CaseInsensitive) == 0)
                coordinateMode = coordinateModes.indexOf(value.variant.toString());
            else
                vars[attr] = value.variant.toReal();
        }
        parser.skipSpace();
        (void)parser.test(COMMA);
    }

    if (gradType == 0) {
        QLinearGradient lg(vars.value("x1"_L1), vars.value("y1"_L1),
                           vars.value("x2"_L1), vars.value("y2"_L1));
        lg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        lg.setStops(stops);
        if (spread != -1)
            lg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(lg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 1) {
        QRadialGradient rg(vars.value("cx"_L1), vars.value("cy"_L1),
                           vars.value("radius"_L1), vars.value("fx"_L1),
                           vars.value("fy"_L1));
        rg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        rg.setStops(stops);
        if (spread != -1)
            rg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(rg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    if (gradType == 2) {
        QConicalGradient cg(vars.value("cx"_L1), vars.value("cy"_L1), vars.value("angle"_L1));
        cg.setCoordinateMode(coordinateMode < 0 ? QGradient::ObjectBoundingMode : QGradient::CoordinateMode(coordinateMode));
        cg.setStops(stops);
        if (spread != -1)
            cg.setSpread(QGradient::Spread(spread));
        BrushData bd = QBrush(cg);
        if (dependsOnThePalette)
            bd.type = BrushData::DependsOnThePalette;
        return bd;
    }

    return BrushData();
}